

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainwindow.cpp
# Opt level: O2

void __thiscall
FSSMainWindow::FSSMainWindow(FSSMainWindow *this,FSSDataModel *_dataModel,QWidget *parent)

{
  MenuRole MVar1;
  QSplitter *this_00;
  FSSResourceModel *this_01;
  QWidget *pQVar2;
  QTreeView *this_02;
  QMenu *pQVar3;
  QMenu *pQVar4;
  char *pcVar5;
  FSSSourcesView *pFVar6;
  QAction *pQVar7;
  __shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2> *this_03;
  ulong uVar8;
  QArrayDataPointer<char16_t> local_c0;
  QArrayDataPointer<char16_t> local_a0;
  QMap<QAction_*,_std::shared_ptr<Data::Source>_> *local_88;
  QAction *action;
  QMenu *local_78;
  QObject local_70 [8];
  QObject local_68 [8];
  QKeySequence local_60 [8];
  PSource data_source;
  QObject local_48 [8];
  __shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  QMainWindow::QMainWindow(&this->super_QMainWindow,parent,0);
  *(undefined ***)this = &PTR_metaObject_00150780;
  *(undefined ***)&this->field_0x10 = &PTR__FSSMainWindow_00150938;
  this->resourceModel = (FSSResourceModel *)0x0;
  local_88 = &this->actions;
  (this->actions).d.d =
       (QMapData<std::map<QAction_*,_std::shared_ptr<Data::Source>,_std::less<QAction_*>,_std::allocator<std::pair<QAction_*const,_std::shared_ptr<Data::Source>_>_>_>_>
        *)0x0;
  this->dataModel = _dataModel;
  this_00 = (QSplitter *)operator_new(0x28);
  QSplitter::QSplitter(this_00,Horizontal,(QWidget *)this);
  QMainWindow::setCentralWidget((QWidget *)this);
  this_01 = (FSSResourceModel *)operator_new(0x10);
  FSSResourceModel::FSSResourceModel(this_01,(QObject *)0x0);
  this->resourceModel = this_01;
  pQVar2 = (QWidget *)operator_new(0x28);
  QString::QString((QString *)&local_c0,"Resources");
  QDockWidget::QDockWidget((QDockWidget *)pQVar2,&local_c0,this,0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c0);
  this_02 = (QTreeView *)operator_new(0x28);
  QTreeView::QTreeView(this_02,pQVar2);
  this->treeResources = this_02;
  QWidget::setSizePolicy((QSizePolicy)SUB84(this_02,0));
  (**(code **)(*(long *)this->treeResources + 0x1c8))(this->treeResources,this->resourceModel);
  QDockWidget::setWidget(pQVar2);
  QMainWindow::addDockWidget((DockWidgetArea)this,(QDockWidget *)0x1);
  pQVar3 = (QMenu *)QMainWindow::menuBar();
  pQVar4 = (QMenu *)operator_new(0x28);
  QString::QString((QString *)&local_c0,"File");
  QMenu::QMenu(pQVar4,(QString *)&local_c0,(QWidget *)this);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c0);
  QString::QString((QString *)&local_c0,"Export");
  QKeySequence::QKeySequence((QKeySequence *)&local_a0);
  QMenu::addAction((QString *)pQVar4,(QObject *)&local_c0,(char *)this,
                   (QKeySequence *)"1exportSource()");
  QKeySequence::~QKeySequence((QKeySequence *)&local_a0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c0);
  QMenuBar::addMenu(pQVar3);
  QString::QString((QString *)&local_c0,"Sources");
  QKeySequence::QKeySequence((QKeySequence *)&local_a0);
  MVar1 = QMenu::addAction((QString *)pQVar4,(QObject *)&local_c0,(char *)this,
                           (QKeySequence *)"1openSources()");
  QKeySequence::~QKeySequence((QKeySequence *)&local_a0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c0);
  QAction::setMenuRole(MVar1);
  pQVar4 = (QMenu *)operator_new(0x28);
  QString::QString((QString *)&local_c0,"View");
  QMenu::QMenu(pQVar4,(QString *)&local_c0,(QWidget *)this);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c0);
  QMenuBar::addMenu(pQVar3);
  QString::QString((QString *)&local_c0,"Resources");
  QKeySequence::QKeySequence((QKeySequence *)&local_a0);
  pcVar5 = (char *)QMenu::addAction((QString *)pQVar4,(QObject *)&local_c0,(char *)pQVar2,
                                    (QKeySequence *)"1setVisible(bool)");
  QKeySequence::~QKeySequence((QKeySequence *)&local_a0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c0);
  QAction::setCheckable(SUB81(pcVar5,0));
  QObject::connect(local_48,(char *)pQVar2,(QObject *)"2visibilityChanged(bool)",pcVar5,0x139703);
  QMetaObject::Connection::~Connection((Connection *)local_48);
  QMenu::addSeparator();
  pFVar6 = (FSSSourcesView *)operator_new(0x40);
  FSSSourcesView::FSSSourcesView(pFVar6,(QWidget *)this_00);
  this->viewSources = pFVar6;
  QWidget::setSizePolicy((QSizePolicy)SUB84(pFVar6,0));
  local_78 = pQVar4;
  for (uVar8 = 0; uVar8 < (ulong)(this->dataModel->data_sources).d.size; uVar8 = uVar8 + 1) {
    FSSDataModel::getDataSource((FSSDataModel *)&data_source,(size_t)this->dataModel);
    pFVar6 = this->viewSources;
    std::__shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,(__shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2> *)&data_source);
    FSSSourcesView::addSource(pFVar6,(PSource *)&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    (**(data_source.super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
       _vptr_Source)(&local_c0);
    QString::QString((QString *)&local_a0,(char *)local_c0.d);
    QKeySequence::QKeySequence(local_60);
    pQVar7 = (QAction *)
             QMenu::addAction((QString *)local_78,(QObject *)&local_a0,(char *)this,
                              (QKeySequence *)"1switchSource(bool)");
    QKeySequence::~QKeySequence(local_60);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    action = pQVar7;
    QAction::setCheckable(SUB81(pQVar7,0));
    QAction::setChecked(SUB81(action,0));
    this_03 = &QMap<QAction_*,_std::shared_ptr<Data::Source>_>::operator[](local_88,&action)->
               super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>::operator=
              (this_03,(__shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2> *)&data_source);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&data_source.super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
  }
  pcVar5 = (char *)QAbstractItemView::selectionModel();
  QObject::connect(local_68,pcVar5,(QObject *)"2currentChanged(QModelIndex,QModelIndex)",
                   (char *)this,0x139752);
  QMetaObject::Connection::~Connection((Connection *)local_68);
  QObject::connect(local_70,(char *)this,(QObject *)"2resourceSelected(Data::Resource,uint)",
                   (char *)this->viewSources,0x1397a4);
  QMetaObject::Connection::~Connection((Connection *)local_70);
  return;
}

Assistant:

FSSMainWindow::FSSMainWindow(FSSDataModel *_dataModel, QWidget *parent)
  : QMainWindow(parent)
  , resourceModel(nullptr)
  , dataModel(_dataModel) {
  QSplitter *mainSplitter = new QSplitter(Qt::Horizontal, this);
  setCentralWidget(mainSplitter);

  resourceModel = new FSSResourceModel();

  QDockWidget *dockResources = new QDockWidget("Resources", this);
  treeResources = new QTreeView(dockResources);
  treeResources->setSizePolicy(QSizePolicy::Preferred, QSizePolicy::Expanding);
  treeResources->setModel(resourceModel);
  dockResources->setWidget(treeResources);
  addDockWidget(Qt::LeftDockWidgetArea, dockResources);

  QMenuBar *menuBar = this->menuBar();

  QMenu *menuFile = new QMenu("File", this);
  menuFile->addAction("Export", this, SLOT(exportSource()));
  menuBar->addMenu(menuFile);
  QAction *action_src = menuFile->addAction("Sources", this,
                                            SLOT(openSources()));
  action_src->setMenuRole(QAction::PreferencesRole);

  QMenu *menuView = new QMenu("View", this);
  menuBar->addMenu(menuView);
  QAction *action = menuView->addAction("Resources", dockResources,
                                        SLOT(setVisible(bool)));
  action->setCheckable(true);
  connect(dockResources, SIGNAL(visibilityChanged(bool)), action,
          SLOT(setChecked(bool)));

  menuView->addSeparator();

  viewSources = new FSSSourcesView(mainSplitter);
  viewSources->setSizePolicy(QSizePolicy::Expanding, QSizePolicy::Expanding);

  for (size_t i = 0; i < dataModel->dataSourceCount(); i++) {
    Data::PSource data_source = dataModel->getDataSource(i);
    viewSources->addSource(data_source);
    QAction *action = menuView->addAction(data_source->get_name().c_str(),
                                          this, SLOT(switchSource(bool)));
    action->setCheckable(true);
    action->setChecked(true);
    actions[action] = data_source;
  }

  connect(treeResources->selectionModel(),
          SIGNAL(currentChanged(QModelIndex,QModelIndex)),
          SLOT(onCurrentChanged(QModelIndex,QModelIndex)));

  connect(this, SIGNAL(resourceSelected(Data::Resource,uint)),
          viewSources, SLOT(onResourceSelected(Data::Resource,uint)));
}